

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O0

Value * soul::createAudioDataObject
                  (Value *__return_storage_ptr__,ValueView *frames,double sampleRate)

{
  string_view className;
  Value *__return_storage_ptr___00;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  double local_20;
  double sampleRate_local;
  ValueView *frames_local;
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_20 = sampleRate;
  sampleRate_local = (double)frames;
  frames_local = (ValueView *)__return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"soul::AudioFile");
  className._M_str = "frames";
  className._M_len = (size_t)local_30._M_str;
  choc::value::
  createObject<char_const(&)[7],choc::value::ValueView_const&,char_const(&)[11],double&>
            (__return_storage_ptr___00,(value *)local_30._M_len,className,
             (char (*) [7])sampleRate_local,(ValueView *)"sampleRate",(char (*) [11])&local_20,
             (double *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value createAudioDataObject (const choc::value::ValueView& frames, double sampleRate)
{
    return choc::value::createObject ("soul::AudioFile",
                                      "frames", frames,
                                      "sampleRate", sampleRate);
}